

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::Clara::Detail::BasicResult<void>::~BasicResult(BasicResult<void> *this)

{
  BasicResult<void> *in_RDI;
  
  ~BasicResult(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }